

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_IncludeWithModifiers::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  Template *pTVar7;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  TemplateString local_3f8;
  TemplateString local_3d8;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [32];
  TemplateString local_340;
  TemplateString local_320;
  allocator local_2f9;
  string local_2f8 [32];
  TemplateString local_2d8;
  TemplateString local_2b8;
  allocator local_291;
  string local_290 [32];
  TemplateString local_270;
  TemplateDictionary local_250 [8];
  TemplateDictionary dict;
  allocator local_1d9;
  string local_1d8 [32];
  Template *local_1b8;
  Template *tpl5;
  string local_1a8 [32];
  Template *local_188;
  Template *tpl4;
  string local_178 [32];
  Template *local_158;
  Template *tpl3;
  string local_148 [32];
  Template *local_128;
  Template *tpl2;
  string local_118 [32];
  Template *local_f8;
  Template *tpl1;
  string local_e8 [32];
  ctemplate local_c8 [8];
  string incname3;
  allocator local_a1;
  string local_a0 [32];
  ctemplate local_80 [8];
  string incname2;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string incname;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"include & print file\n",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"inc2\n",&local_a1);
  ctemplate::StringToTemplateFile(local_80,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"yo&yo",(allocator *)((long)&tpl1 + 7));
  ctemplate::StringToTemplateFile(local_c8,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl1 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"hi {{>INC:h}} bar\n",(allocator *)((long)&tpl2 + 7));
  pTVar7 = ctemplate::StringToTemplate((string *)local_118,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl2 + 7));
  local_f8 = pTVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"hi {{>INC:javascript_escape}} bar\n",(allocator *)((long)&tpl3 + 7));
  pTVar7 = ctemplate::StringToTemplate((string *)local_148,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl3 + 7));
  local_128 = pTVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_178,"hi {{>INC:pre_escape}} bar\n",(allocator *)((long)&tpl4 + 7));
  pTVar7 = ctemplate::StringToTemplate((string *)local_178,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl4 + 7));
  local_158 = pTVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"hi {{>INC:u}} bar\n",(allocator *)((long)&tpl5 + 7));
  pTVar7 = ctemplate::StringToTemplate((string *)local_1a8,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl5 + 7));
  local_188 = pTVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"hi {{>INC:h}} bar {{>INC}} baz\n",&local_1d9);
  pTVar7 = ctemplate::StringToTemplate((string *)local_1d8,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  local_1b8 = pTVar7;
  ctemplate::TemplateString::TemplateString(&local_270,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_250,&local_270,(UnsafeArena *)0x0);
  pTVar7 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"hi  bar\n",&local_291);
  ctemplate::AssertExpandIs(pTVar7,local_250,(string *)local_290,true);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  ctemplate::TemplateString::TemplateString(&local_2b8,"INC");
  TVar1.length_ = local_2b8.length_;
  TVar1.ptr_ = local_2b8.ptr_;
  TVar1.is_immutable_ = local_2b8.is_immutable_;
  TVar1._17_7_ = local_2b8._17_7_;
  TVar1.id_ = local_2b8.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_2d8,(string *)local_28);
  TVar2.length_ = local_2d8.length_;
  TVar2.ptr_ = local_2d8.ptr_;
  TVar2.is_immutable_ = local_2d8.is_immutable_;
  TVar2._17_7_ = local_2d8._17_7_;
  TVar2.id_ = local_2d8.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  pTVar7 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"hi include &amp; print file  bar\n",&local_2f9);
  ctemplate::AssertExpandIs(pTVar7,local_250,(string *)local_2f8,true);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  ctemplate::TemplateString::TemplateString(&local_320,"INC");
  TVar3.length_ = local_320.length_;
  TVar3.ptr_ = local_320.ptr_;
  TVar3.is_immutable_ = local_320.is_immutable_;
  TVar3._17_7_ = local_320._17_7_;
  TVar3.id_ = local_320.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  ctemplate::TemplateString::TemplateString(&local_340,(string *)local_80);
  TVar4.length_ = local_340.length_;
  TVar4.ptr_ = local_340.ptr_;
  TVar4.is_immutable_ = local_340.is_immutable_;
  TVar4._17_7_ = local_340._17_7_;
  TVar4.id_ = local_340.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar4);
  pTVar7 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"hi include &amp; print file inc2  bar\n",&local_361);
  ctemplate::AssertExpandIs(pTVar7,local_250,(string *)local_360,true);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  pTVar7 = local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"hi include \\x26 print file\\ninc2\\n bar\n",&local_389);
  ctemplate::AssertExpandIs(pTVar7,local_250,(string *)local_388,true);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  pTVar7 = local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"hi include &amp; print file\ninc2\n bar\n",&local_3b1);
  ctemplate::AssertExpandIs(pTVar7,local_250,(string *)local_3b0,true);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  ctemplate::TemplateString::TemplateString(&local_3d8,"INC");
  TVar5.length_ = local_3d8.length_;
  TVar5.ptr_ = local_3d8.ptr_;
  TVar5.is_immutable_ = local_3d8.is_immutable_;
  TVar5._17_7_ = local_3d8._17_7_;
  TVar5.id_ = local_3d8.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar5);
  ctemplate::TemplateString::TemplateString(&local_3f8,(string *)local_c8);
  TVar6.length_ = local_3f8.length_;
  TVar6.ptr_ = local_3f8.ptr_;
  TVar6.is_immutable_ = local_3f8.is_immutable_;
  TVar6._17_7_ = local_3f8._17_7_;
  TVar6.id_ = local_3f8.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar6);
  pTVar7 = local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_418,"hi include+%26+print+file%0Ainc2%0Ayo%26yo bar\n",&local_419);
  ctemplate::AssertExpandIs(pTVar7,local_250,(string *)local_418,true);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  pTVar7 = local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_440,
             "hi include &amp; print file inc2 yo&amp;yo bar include & print file\ninc2\nyo&yo baz\n"
             ,&local_441);
  ctemplate::AssertExpandIs(pTVar7,local_250,(string *)local_440,true);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_250);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

TEST(Template, IncludeWithModifiers) {
  string incname = StringToTemplateFile("include & print file\n");
  string incname2 = StringToTemplateFile("inc2\n");
  string incname3 = StringToTemplateFile("yo&yo");
  // Note this also tests that html-escape, but not javascript-escape or
  // pre-escape, escapes \n to <space>
  Template* tpl1 = StringToTemplate("hi {{>INC:h}} bar\n", DO_NOT_STRIP);
  Template* tpl2 = StringToTemplate("hi {{>INC:javascript_escape}} bar\n",
                                    DO_NOT_STRIP);
  Template* tpl3 = StringToTemplate("hi {{>INC:pre_escape}} bar\n",
                                    DO_NOT_STRIP);
  Template* tpl4 = StringToTemplate("hi {{>INC:u}} bar\n", DO_NOT_STRIP);
  // Test that if we include the same template twice, once with a modifer
  // and once without, they each get applied properly.
  Template* tpl5 = StringToTemplate("hi {{>INC:h}} bar {{>INC}} baz\n",
                                    DO_NOT_STRIP);

  TemplateDictionary dict("dict");
  AssertExpandIs(tpl1, &dict, "hi  bar\n", true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl1, &dict, "hi include &amp; print file  bar\n", true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname2);
  AssertExpandIs(tpl1, &dict, "hi include &amp; print file inc2  bar\n",
                 true);
  AssertExpandIs(tpl2, &dict, "hi include \\x26 print file\\ninc2\\n bar\n",
                 true);
  AssertExpandIs(tpl3, &dict, "hi include &amp; print file\ninc2\n bar\n",
                 true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname3);
  AssertExpandIs(tpl4, &dict,
                 "hi include+%26+print+file%0Ainc2%0Ayo%26yo bar\n",
                 true);
  AssertExpandIs(tpl5, &dict,
                 "hi include &amp; print file inc2 yo&amp;yo bar "
                 "include & print file\ninc2\nyo&yo baz\n",
                 true);

  // Don't test modifier syntax here; that's in TestVariableWithModifiers()
}